

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

int makeFileById(int id,string *name,string *str)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char t [252];
  char acStack_138 [264];
  
  lVar5 = (long)inodes[id].i_blocks[0] * 0x1000;
  lVar7 = 0;
  while (emptyspaces[lVar7 + lVar5] != '\0') {
    lVar7 = lVar7 + 0x100;
    if (lVar7 == 0x1000) {
      return 0;
    }
  }
  strcpy(acStack_138,(name->_M_dataplus)._M_p);
  strcpy(emptyspaces + lVar7 + lVar5,acStack_138);
  piVar2 = &inodes[0].i_mode;
  uVar1 = 0;
  do {
    if (super_block.inode_bitmap[uVar1] == false) {
      *(int *)(emptyspaces + lVar7 + lVar5 + 0xfc) = (int)uVar1;
      *piVar2 = 2;
      super_block.inode_bitmap[uVar1] = true;
      goto LAB_0010353c;
    }
    uVar1 = uVar1 + 1;
    piVar2 = piVar2 + 8;
  } while (uVar1 != 0x1000);
  uVar1 = 0x1000;
LAB_0010353c:
  lVar5 = 0;
  do {
    if (super_block.block_bitmap[lVar5] == false) {
      inodes[uVar1 & 0xffffffff].i_blocks[0] = (int)lVar5;
      super_block.block_bitmap[lVar5] = true;
      goto LAB_0010356e;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1000);
  lVar5 = 0x1000;
LAB_0010356e:
  uVar4 = str->_M_string_length;
  if (uVar4 != 0) {
    uVar6 = 0;
    do {
      emptyspaces[uVar6 + lVar5 * 0x1000] = (str->_M_dataplus)._M_p[uVar6];
      uVar6 = uVar6 + 1;
      uVar4 = str->_M_string_length;
    } while (uVar6 < uVar4);
  }
  iVar3 = (int)uVar4;
  inodes[uVar1 & 0xffffffff].i_file_size = iVar3;
  for (; id != 0; id = *(int *)(emptyspaces + (long)inodes[id].i_blocks[0] * 0x1000 + 0x1fc)) {
    inodes[id].i_file_size = inodes[id].i_file_size + iVar3;
  }
  inodes[0].i_file_size = inodes[0].i_file_size + iVar3;
  return (int)uVar1;
}

Assistant:

int makeFileById(int id, string name, string str) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    bool isfull = true;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") == 0) {//找到空的目录项
            isfull = false;
            char t[252];
            strcpy(t, name.c_str());
            strcpy(p->dirs[i].name, t);//名字
            break;
        }
    }
    if(isfull){
        return 0;
    }
    int j;
    for (j = 0; j < 4096; j++) {
        if (!super_block.inode_bitmap[j]) {
            p->dirs[i].inode_id = j;
            inodes[j].i_mode = A_FILE;
            super_block.inode_bitmap[j] = true;
            break;
        }
    }
    int k;
    for (k = 0; k < 4096; k++) {
        if (!super_block.block_bitmap[k]) {
            inodes[j].i_blocks[0] = k;
            super_block.block_bitmap[k] = true;
            break;
        }
    }
    File_Block *q = getAddressByLocation_File(k);
    for (int m = 0; m < str.size(); m++) {
        q->data[m] = str[m];
    }
    inodes[j].i_file_size = str.size();//文件大小
    int cur = id;
    while (cur)
    {
        inodes[cur].i_file_size += str.size();
        cur = getParentById(cur);
    }
    inodes[0].i_file_size += str.size();
    return j;
}